

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.hpp
# Opt level: O1

string * __thiscall
CLI::Formatter::make_help
          (string *__return_storage_ptr__,Formatter *this,App *app,string *name,AppFormatMode mode)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  ostream *poVar4;
  stringstream out;
  string local_1f8;
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  if (mode == Sub) {
    (*(this->super_FormatterBase)._vptr_FormatterBase[7])(__return_storage_ptr__,this,app);
  }
  else {
    ::std::__cxx11::stringstream::stringstream(local_1b8);
    if (((app->name_)._M_string_length == 0) && (app->parent_ != (App *)0x0)) {
      iVar3 = ::std::__cxx11::string::compare((char *)&app->group_);
      if (iVar3 != 0) {
        poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,(app->group_)._M_dataplus._M_p,(app->group_)._M_string_length)
        ;
        local_1f8._M_dataplus._M_p._0_1_ = 0x3a;
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_1f8,1);
      }
    }
    (*(this->super_FormatterBase)._vptr_FormatterBase[9])(&local_1f8,this,app);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,
               (char *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_),
               local_1f8._M_string_length);
    paVar1 = &local_1f8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_) != paVar1) {
      operator_delete((undefined1 *)
                      CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_));
    }
    local_1d8[0] = local_1c8;
    pcVar2 = (name->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_1d8,pcVar2,pcVar2 + name->_M_string_length);
    (*(this->super_FormatterBase)._vptr_FormatterBase[10])(&local_1f8,this,app,local_1d8);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,
               (char *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_),
               local_1f8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_) != paVar1) {
      operator_delete((undefined1 *)
                      CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_));
    }
    if (local_1d8[0] != local_1c8) {
      operator_delete(local_1d8[0]);
    }
    (*(this->super_FormatterBase)._vptr_FormatterBase[4])(&local_1f8,this,app);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,
               (char *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_),
               local_1f8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_) != paVar1) {
      operator_delete((undefined1 *)
                      CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_));
    }
    make_groups_abi_cxx11_(&local_1f8,this,app,mode);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,
               (char *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_),
               local_1f8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_) != paVar1) {
      operator_delete((undefined1 *)
                      CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_));
    }
    (*(this->super_FormatterBase)._vptr_FormatterBase[5])(&local_1f8,this,app,(ulong)mode);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,
               (char *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_),
               local_1f8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_) != paVar1) {
      operator_delete((undefined1 *)
                      CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_));
    }
    local_1f8._M_dataplus._M_p._0_1_ = 10;
    poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_1f8,1);
    (*(this->super_FormatterBase)._vptr_FormatterBase[8])(&local_1f8,this,app);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,(char *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,
                                       local_1f8._M_dataplus._M_p._0_1_),local_1f8._M_string_length)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_) != paVar1) {
      operator_delete((undefined1 *)
                      CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_));
    }
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::stringstream::~stringstream(local_1b8);
    ::std::ios_base::~ios_base(local_138);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_help(const App *app, std::string name, AppFormatMode mode) const {

    // This immediately forwards to the make_expanded method. This is done this way so that subcommands can
    // have overridden formatters
    if(mode == AppFormatMode::Sub)
        return make_expanded(app);

    std::stringstream out;
    if((app->get_name().empty()) && (app->get_parent() != nullptr)) {
        if(app->get_group() != "Subcommands") {
            out << app->get_group() << ':';
        }
    }

    out << make_description(app);
    out << make_usage(app, name);
    out << make_positionals(app);
    out << make_groups(app, mode);
    out << make_subcommands(app, mode);
    out << '\n' << make_footer(app);

    return out.str();
}